

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.h
# Opt level: O1

void llvm::yaml::skip<llvm::yaml::MappingNode>(MappingNode *C)

{
  iterator i;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_10;
  
  if (C->IsAtBeginning == false) {
    if (C->IsAtEnd != true) {
      __assert_fail("(C.IsAtBeginning || C.IsAtEnd) && \"Cannot skip mid parse!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/YAMLParser.h"
                    ,0x187,
                    "void llvm::yaml::skip(CollectionType &) [CollectionType = llvm::yaml::MappingNode]"
                   );
    }
  }
  else {
    local_10.Base = (MappingNode *)begin<llvm::yaml::MappingNode>(C);
    if (local_10.Base != (MappingNode *)0x0) {
      do {
        if ((local_10.Base)->CurrentEntry == (KeyValueNode *)0x0) {
          __assert_fail("Base && Base->CurrentEntry && \"Attempted to access end iterator!\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/YAMLParser.h"
                        ,0x14b,
                        "ValueT *llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode, llvm::yaml::KeyValueNode>::operator->() const [BaseT = llvm::yaml::MappingNode, ValueT = llvm::yaml::KeyValueNode]"
                       );
        }
        KeyValueNode::skip((local_10.Base)->CurrentEntry);
        basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::operator++
                  (&local_10);
      } while (local_10.Base != (MappingNode *)0x0);
    }
  }
  return;
}

Assistant:

void skip(CollectionType &C) {
  // TODO: support skipping from the middle of a parsed collection ;/
  assert((C.IsAtBeginning || C.IsAtEnd) && "Cannot skip mid parse!");
  if (C.IsAtBeginning)
    for (typename CollectionType::iterator i = begin(C), e = C.end(); i != e;
         ++i)
      i->skip();
}